

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

Anim * get_next_anim(Sprite *spr)

{
  uint i;
  Sprite *spr_local;
  
  i = 0;
  while( true ) {
    if (9 < i) {
      return &get_next_anim::dummy_anim;
    }
    if (spr->anims[i].lval == (float *)0x0) break;
    i = i + 1;
  }
  return spr->anims + i;
}

Assistant:

static Anim *get_next_anim(Sprite *spr)
{
   static Anim dummy_anim;
   unsigned i;

   for (i = 0; i < MAX_ANIMS; i++) {
      if (spr->anims[i].lval == NULL)
         return &spr->anims[i];
   }

   assert(false);
   return &dummy_anim;
}